

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

int32_t GetCheckRatio(NodeContext *node_ctx)

{
  uint uVar1;
  int64_t iVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"-checkaddrman","");
  iVar2 = ArgsManager::GetIntArg((ArgsManager *)node_ctx,&local_40,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  uVar4 = (uint)iVar2;
  uVar3 = 1000000;
  if (uVar4 < 1000000) {
    uVar3 = uVar4;
  }
  uVar1 = 0;
  if (-1 < (int)uVar4) {
    uVar1 = uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int32_t GetCheckRatio(const NodeContext& node_ctx)
{
    return std::clamp<int32_t>(node_ctx.args->GetIntArg("-checkaddrman", 100), 0, 1000000);
}